

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

TypeId __thiscall
Js::JavascriptNativeIntArray::TrySetNativeIntArrayItem
          (JavascriptNativeIntArray *this,Var value,int32 *iValue,double *dValue)

{
  bool bVar1;
  int32 iVar2;
  double value_00;
  double d;
  bool local_35;
  int32 i_1;
  bool isInt32;
  double *pdStack_30;
  int32 i;
  double *dValue_local;
  int32 *iValue_local;
  Var value_local;
  JavascriptNativeIntArray *this_local;
  
  pdStack_30 = dValue;
  dValue_local = (double *)iValue;
  iValue_local = (int32 *)value;
  value_local = this;
  bVar1 = TaggedInt::Is(value);
  if (bVar1) {
    iVar2 = TaggedInt::ToInt32(iValue_local);
    if (iVar2 != -0x7fffe) {
      *(int32 *)dValue_local = iVar2;
      return TypeIds_NativeIntArray;
    }
    i_1 = -0x7fffe;
  }
  else {
    bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(iValue_local);
    if (bVar1) {
      value_00 = JavascriptNumber::GetValue(iValue_local);
      bVar1 = JavascriptNumber::TryGetInt32OrUInt32Value(value_00,(int32 *)((long)&d + 4),&local_35)
      ;
      if (!bVar1) {
        *pdStack_30 = value_00;
        ToNativeFloatArray(this);
        return TypeIds_ArrayLast;
      }
      if (((local_35 & 1U) != 0) && (d._4_4_ != -0x7fffe)) {
        *(int *)dValue_local = d._4_4_;
        return TypeIds_NativeIntArray;
      }
    }
  }
  ToVarArray(this);
  return TypeIds_Array;
}

Assistant:

TypeId JavascriptNativeIntArray::TrySetNativeIntArrayItem(Var value, int32 *iValue, double *dValue)
    {
        if (TaggedInt::Is(value))
        {
            int32 i = TaggedInt::ToInt32(value);
            if (i != JavascriptNativeIntArray::MissingItem)
            {
                *iValue = i;
                return TypeIds_NativeIntArray;
            }
        }
        else if (JavascriptNumber::Is_NoTaggedIntCheck(value))
        {
            bool isInt32;
            int32 i;
            double d = JavascriptNumber::GetValue(value);
            if (JavascriptNumber::TryGetInt32OrUInt32Value(d, &i, &isInt32))
            {
                if (isInt32 && i != JavascriptNativeIntArray::MissingItem)
                {
                    *iValue = i;
                    return TypeIds_NativeIntArray;
                }
            }
            else
            {
                *dValue = d;
                JavascriptNativeIntArray::ToNativeFloatArray(this);
                return TypeIds_NativeFloatArray;
            }
        }

        JavascriptNativeIntArray::ToVarArray(this);
        return TypeIds_Array;
    }